

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalDirectiveExpressionSyntax *args_2;
  BinaryConditionalDirectiveExpressionSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*> *)0x7b07d6);
  args_2 = deepClone<slang::syntax::ConditionalDirectiveExpressionSyntax>
                     ((ConditionalDirectiveExpressionSyntax *)__child_stack,
                      in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ConditionalDirectiveExpressionSyntax_*> *)0x7b0813);
  deepClone<slang::syntax::ConditionalDirectiveExpressionSyntax>
            ((ConditionalDirectiveExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                     (this,(ConditionalDirectiveExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryConditionalDirectiveExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryConditionalDirectiveExpressionSyntax>(
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.right, alloc)
    );
}